

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O0

void __thiscall
MultiQuery<dto::Simple,_dto::Complex>::on_output
          (MultiQuery<dto::Simple,_dto::Complex> *this,Poll *p)

{
  int __fd;
  undefined8 this_00;
  void *__buf;
  size_t __n;
  ssize_t sVar1;
  long lVar2;
  Error *this_01;
  ostream *poVar3;
  shared_ptr<Alarm> local_58 [2];
  undefined1 local_38 [8];
  string data;
  Poll *p_local;
  MultiQuery<dto::Simple,_dto::Complex> *this_local;
  
  data.field_2._8_8_ = p;
  ::dto::marshall<dto::Simple>((string *)local_38,&this->req);
  __fd = (this->super_Subscriber).fd;
  __buf = (void *)std::__cxx11::string::operator[]((ulong)local_38);
  __n = std::__cxx11::string::size();
  sVar1 = sendto(__fd,__buf,__n,0,(sockaddr *)&this->remote,0x10);
  lVar2 = std::__cxx11::string::size();
  if (sVar1 != lVar2) {
    this_01 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(this_01,"Could not write");
    __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"MultiQuery: sent ");
  poVar3 = operator<<(poVar3,&this->req);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Subscriber::set_expected(&this->super_Subscriber,1);
  Poll::notify_subscriber_changed((Poll *)data.field_2._8_8_,&this->super_Subscriber);
  this_00 = data.field_2._8_8_;
  if (this->timeout < 1) {
    Poll::unsubscribe((Poll *)data.field_2._8_8_,&this->super_Subscriber);
  }
  else {
    std::
    make_shared<Alarm,int&,MultiQuery<dto::Simple,dto::Complex>::on_output(Poll&)::_lambda()_1_>
              ((int *)local_58,(anon_class_16_2_fd512ddd *)&this->timeout);
    Poll::subscribe_alarm((Poll *)this_00,local_58);
    std::shared_ptr<Alarm>::~shared_ptr(local_58);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void MultiQuery<REQ, RES>::on_output(Poll &p) {
  auto data = dto::marshall(this->req);
  if (sendto(fd, &data[0], data.size(), 0, (struct sockaddr *) &remote, sizeof(remote)) != data.size()) {
    throw Error("Could not write");
  }
  std::cout << "MultiQuery: sent " << this->req << std::endl;
  set_expected(POLLIN);
  p.notify_subscriber_changed(*this);
  if (this->timeout > 0) {
    p.subscribe_alarm(std::make_shared<Alarm>(this->timeout, [&] {
      if (this->done)
        this->done();
      p.unsubscribe(*this);
    }));
  } else {
    p.unsubscribe(*this);
  }
}